

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O1

Abc_Cex_t * Bmc_CexCareExtendToObjects(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Abc_Cex_t *pAVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  
  if (pCex->nPis != pCexCare->nPis) {
    __assert_fail("pCex->nPis == pCexCare->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x33,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nRegs != pCexCare->nRegs) {
    __assert_fail("pCex->nRegs == pCexCare->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x34,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  if (pCex->nBits != pCexCare->nBits) {
    __assert_fail("pCex->nBits == pCexCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                  ,0x35,
                  "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
  }
  pAVar5 = Abc_CexAlloc(pCex->nRegs,p->nObjs,pCex->iFrame + 1);
  pAVar5->iFrame = pCex->iFrame;
  pAVar5->iPo = pCex->iPo;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    iVar6 = 0;
    do {
      iVar7 = p->vCos->nSize;
      uVar14 = (iVar7 - iVar8) + iVar6;
      if (((int)uVar14 < 0) || (iVar7 <= (int)uVar14)) goto LAB_00571e10;
      iVar8 = p->vCos->pArray[uVar14];
      lVar9 = (long)iVar8;
      if ((lVar9 < 0) || (p->nObjs <= iVar8)) goto LAB_00571df1;
      pGVar13 = p->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar13 + lVar9) = *(ulong *)(pGVar13 + lVar9) & 0xbfffffffbfffffff | 0x40000000;
      iVar6 = iVar6 + 1;
      iVar8 = p->nRegs;
    } while (iVar6 < iVar8);
  }
  if (-1 < pCex->iFrame) {
    iVar8 = 0;
    do {
      pVVar12 = p->vCis;
      uVar15 = (ulong)(uint)pVVar12->nSize;
      if (p->nRegs < pVVar12->nSize) {
        lVar9 = 0;
        do {
          if ((int)uVar15 <= lVar9) goto LAB_00571e10;
          iVar6 = pVVar12->pArray[lVar9];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00571df1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = p->pObjs + iVar6;
          uVar14 = pCexCare->nPis * iVar8 + pCexCare->nRegs + (int)lVar9;
          if (((uint)(&pCexCare[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
            uVar15 = *(ulong *)pGVar13 | 0x4000000040000000;
          }
          else {
            uVar14 = pCex->nPis * iVar8 + pCex->nRegs + (int)lVar9;
            if (((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
              uVar15 = *(ulong *)pGVar13 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar15 = (*(ulong *)pGVar13 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
          }
          *(ulong *)pGVar13 = uVar15;
          lVar9 = lVar9 + 1;
          pVVar12 = p->vCis;
          uVar15 = (ulong)pVVar12->nSize;
        } while (lVar9 < (long)(uVar15 - (long)p->nRegs));
      }
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar7 = 0;
        do {
          iVar2 = p->vCis->nSize;
          uVar14 = iVar7 + (iVar2 - iVar6);
          if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_00571e10;
          iVar3 = p->vCis->pArray[uVar14];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00571df1;
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar13 + iVar3;
          uVar15 = *(ulong *)pGVar1;
          if (((~(uint)uVar15 & 0x9fffffff) != 0) ||
             (uVar14 = (uint)(uVar15 >> 0x20) & 0x1fffffff, (int)uVar14 < iVar2 - iVar6)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar6 = p->vCos->nSize;
          uVar14 = (iVar6 - iVar2) + uVar14;
          if (((int)uVar14 < 0) || (iVar6 <= (int)uVar14)) goto LAB_00571e10;
          iVar6 = p->vCos->pArray[uVar14];
          lVar9 = (long)iVar6;
          if ((lVar9 < 0) || (p->nObjs <= iVar6)) goto LAB_00571df1;
          if ((*(ulong *)(pGVar13 + lVar9) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3b4,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar16 = *(ulong *)(pGVar13 + lVar9) & 0x40000000;
          *(ulong *)pGVar1 = uVar15 & 0xffffffffbfffffff | uVar16;
          *(ulong *)pGVar1 =
               uVar15 & 0xbfffffffbfffffff | uVar16 |
               *(ulong *)(pGVar13 + lVar9) & 0x4000000000000000;
          iVar7 = iVar7 + 1;
          iVar6 = p->nRegs;
        } while (iVar7 < iVar6);
      }
      if (0 < p->nObjs) {
        lVar9 = 0;
        lVar17 = 0;
        do {
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          uVar15 = *(ulong *)(&pGVar13->field_0x0 + lVar9);
          uVar14 = (uint)uVar15;
          if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar16 = *(ulong *)((long)pGVar13 +
                               lVar9 + (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3) &
                     0x4000000040000000;
            if (uVar16 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39c,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar10 = *(ulong *)((long)pGVar13 +
                               lVar9 + (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar10 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x39d,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            if ((((((uVar14 >> 0x1d & 1) == 0) || (uVar16 != 0x4000000000000000)) &&
                 (((uVar14 >> 0x1d & 1) != 0 || (uVar16 != 0x40000000)))) &&
                (((uVar15 >> 0x3d & 1) == 0 || (uVar10 != 0x4000000000000000)))) &&
               (((uVar15 >> 0x3d & 1) != 0 || (uVar10 != 0x40000000)))) {
              if ((((byte)(uVar15 >> 0x1d) & 1 & uVar16 == 0x40000000) != 0) ||
                 ((uVar15 >> 0x1d & 1) == 0 && uVar16 == 0x4000000000000000)) {
                bVar11 = (byte)(uVar15 >> 0x3d) & 1;
                if (((bVar11 & uVar10 == 0x40000000) != 0) ||
                   (bVar11 == 0 && uVar10 == 0x4000000000000000)) {
                  uVar15 = (uVar15 & 0xbfffffff3fffffff) + 0x4000000000000000;
                  goto LAB_00571bac;
                }
              }
              uVar15 = uVar15 | 0x4000000040000000;
            }
            else {
              uVar15 = uVar15 & 0xbfffffff3fffffff | 0x40000000;
            }
LAB_00571bac:
            *(ulong *)(&pGVar13->field_0x0 + lVar9) = uVar15;
          }
          lVar17 = lVar17 + 1;
          lVar9 = lVar9 + 0xc;
        } while (lVar17 < p->nObjs);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar9 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar9];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00571df1;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar13 = p->pObjs + iVar6;
          uVar15 = *(ulong *)pGVar13;
          uVar14 = (uint)uVar15;
          if ((-1 < (int)uVar14) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a7,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar16 = *(ulong *)(pGVar13 + -(ulong)(uVar14 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar16 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x3a8,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if ((((uVar14 >> 0x1d & 1) == 0) || (uVar16 != 0x4000000000000000)) &&
             (((uVar14 >> 0x1d & 1) != 0 || (uVar16 != 0x40000000)))) {
            if ((((byte)(uVar15 >> 0x1d) & 1 & uVar16 == 0x40000000) == 0) &&
               ((uVar15 >> 0x1d & 1) != 0 || uVar16 != 0x4000000000000000)) {
              uVar15 = uVar15 | 0x4000000040000000;
            }
            else {
              uVar15 = (uVar15 & 0xbfffffffbfffffff) + 0x4000000000000000;
            }
          }
          else {
            uVar15 = uVar15 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar13 = uVar15;
          lVar9 = lVar9 + 1;
          pVVar12 = p->vCos;
        } while (lVar9 < pVVar12->nSize);
      }
      if ((0 < p->nObjs) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
        lVar9 = 0;
        do {
          if ((~*(ulong *)pGVar13 & 0x4000000040000000) != 0) {
            iVar6 = pAVar5->nPis * iVar8 + pAVar5->nRegs + (int)lVar9;
            (&pAVar5[1].iPo)[iVar6 >> 5] = (&pAVar5[1].iPo)[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
          }
          lVar9 = lVar9 + 1;
          pGVar13 = pGVar13 + 1;
        } while (lVar9 < p->nObjs);
      }
      bVar4 = iVar8 < pCex->iFrame;
      iVar8 = iVar8 + 1;
    } while (bVar4);
  }
  uVar14 = pCex->iPo;
  iVar8 = p->vCos->nSize;
  if (iVar8 - p->nRegs <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < iVar8)) {
    iVar8 = p->vCos->pArray[uVar14];
    if ((-1 < (long)iVar8) && (iVar8 < p->nObjs)) {
      if (((undefined1  [12])p->pObjs[iVar8] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x4000000000000000) {
        __assert_fail("Gia_ObjTerSimGet1(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                      ,0x55,
                      "Abc_Cex_t *Bmc_CexCareExtendToObjects(Gia_Man_t *, Abc_Cex_t *, Abc_Cex_t *)"
                     );
      }
      return pAVar5;
    }
LAB_00571df1:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_00571e10:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Takes CEX and its care-set. Returns care-set of all objects.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Cex_t * Bmc_CexCareExtendToObjects( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj;
    int i, k;
    assert( pCex->nPis == pCexCare->nPis );
    assert( pCex->nRegs == pCexCare->nRegs );
    assert( pCex->nBits == pCexCare->nBits );
    // start the counter-example
    pNew = Abc_CexAlloc( pCex->nRegs, Gia_ManObjNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // initialize terminary simulation
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
        // add cares to the exdended counter-example
        Gia_ManForEachObj( p, pObj, k )
            if ( !Gia_ObjTerSimGetX(pObj) )
                Abc_InfoSetBit( pNew->pData, pNew->nRegs + pNew->nPis * i + k );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    assert( Gia_ObjTerSimGet1(pObj) );
    return pNew;
}